

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall maths::Matrix::transpose(Matrix *this)

{
  double **extraout_RDX;
  double **ppdVar1;
  int *in_RSI;
  long in_RDI;
  Matrix MVar2;
  int j;
  int i;
  Matrix *ret;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  int local_18;
  
  Matrix((Matrix *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  ppdVar1 = extraout_RDX;
  for (local_18 = 0; local_18 < *in_RSI; local_18 = local_18 + 1) {
    for (iVar3 = 0; iVar3 < in_RSI[1]; iVar3 = iVar3 + 1) {
      ppdVar1 = (double **)(long)iVar3;
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + (long)iVar3 * 8) + (long)local_18 * 8) =
           *(undefined8 *)
            (*(long *)(*(long *)(in_RSI + 2) + (long)local_18 * 8) + (long)ppdVar1 * 8);
    }
  }
  MVar2.p = ppdVar1;
  MVar2._0_8_ = in_RDI;
  return MVar2;
}

Assistant:

Matrix Matrix::transpose()
{
    Matrix ret(cols_, rows_);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            ret.p[j][i] = p[i][j];
        }
    }
    return ret;
}